

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-alloc-cb-fail.c
# Opt level: O1

int run_test_tcp_alloc_cb_fail(void)

{
  int iVar1;
  int extraout_EAX;
  uv_tcp_t *puVar2;
  undefined8 unaff_RBX;
  int iVar3;
  undefined1 *puVar4;
  undefined8 uVar5;
  char *pcVar6;
  uv_write_t *puVar7;
  sockaddr_in addr;
  uv_connect_t connect_req;
  undefined1 auStack_90 [16];
  code *pcStack_80;
  undefined1 auStack_78 [16];
  
  pcVar6 = "0.0.0.0";
  iVar3 = 0x23a3;
  pcStack_80 = (code *)0x16fba3;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&stack0xffffffffffffff98);
  if (iVar1 == 0) {
    pcStack_80 = (code *)0x16fbb0;
    puVar2 = (uv_tcp_t *)uv_default_loop();
    iVar3 = 0x31c630;
    pcStack_80 = (code *)0x16fbbf;
    iVar1 = uv_tcp_init();
    if (iVar1 != 0) goto LAB_0016fccc;
    puVar2 = &server;
    puVar4 = &stack0xffffffffffffff98;
    pcStack_80 = (code *)0x16fbda;
    iVar1 = uv_tcp_bind(&server,puVar4,0);
    iVar3 = (int)puVar4;
    if (iVar1 != 0) goto LAB_0016fcd1;
    puVar2 = &server;
    iVar3 = 0x80;
    pcStack_80 = (code *)0x16fbfa;
    iVar1 = uv_listen(&server,0x80,connection_cb);
    if (iVar1 != 0) goto LAB_0016fcd6;
    puVar2 = (uv_tcp_t *)0x194b6a;
    iVar3 = 0x23a3;
    pcStack_80 = (code *)0x16fc16;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_78);
    if (iVar1 != 0) goto LAB_0016fcdb;
    pcStack_80 = (code *)0x16fc23;
    puVar2 = (uv_tcp_t *)uv_default_loop();
    iVar3 = 0x31c528;
    pcStack_80 = (code *)0x16fc32;
    iVar1 = uv_tcp_init();
    if (iVar1 != 0) goto LAB_0016fce0;
    iVar3 = 0x31c528;
    puVar2 = (uv_tcp_t *)&stack0xffffffffffffff98;
    pcStack_80 = (code *)0x16fc55;
    iVar1 = uv_tcp_connect(puVar2,&client,auStack_78,connect_cb);
    if (iVar1 != 0) goto LAB_0016fce5;
    pcStack_80 = (code *)0x16fc62;
    puVar2 = (uv_tcp_t *)uv_default_loop();
    iVar3 = 0;
    pcStack_80 = (code *)0x16fc6c;
    iVar1 = uv_run();
    if (iVar1 != 0) goto LAB_0016fcea;
    if (connect_cb_called != 1) goto LAB_0016fcef;
    if (connection_cb_called != 1) goto LAB_0016fcf4;
    if (close_cb_called != 3) goto LAB_0016fcf9;
    pcStack_80 = (code *)0x16fc90;
    unaff_RBX = uv_default_loop();
    pcStack_80 = (code *)0x16fca4;
    uv_walk(unaff_RBX,close_walk_cb,0);
    iVar3 = 0;
    pcStack_80 = (code *)0x16fcae;
    uv_run(unaff_RBX);
    pcStack_80 = (code *)0x16fcb3;
    puVar2 = (uv_tcp_t *)uv_default_loop();
    pcStack_80 = (code *)0x16fcbb;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_80 = (code *)0x16fccc;
    run_test_tcp_alloc_cb_fail_cold_1();
    puVar2 = (uv_tcp_t *)pcVar6;
LAB_0016fccc:
    pcStack_80 = (code *)0x16fcd1;
    run_test_tcp_alloc_cb_fail_cold_2();
LAB_0016fcd1:
    pcStack_80 = (code *)0x16fcd6;
    run_test_tcp_alloc_cb_fail_cold_3();
LAB_0016fcd6:
    pcStack_80 = (code *)0x16fcdb;
    run_test_tcp_alloc_cb_fail_cold_4();
LAB_0016fcdb:
    pcStack_80 = (code *)0x16fce0;
    run_test_tcp_alloc_cb_fail_cold_5();
LAB_0016fce0:
    pcStack_80 = (code *)0x16fce5;
    run_test_tcp_alloc_cb_fail_cold_6();
LAB_0016fce5:
    pcStack_80 = (code *)0x16fcea;
    run_test_tcp_alloc_cb_fail_cold_7();
LAB_0016fcea:
    pcStack_80 = (code *)0x16fcef;
    run_test_tcp_alloc_cb_fail_cold_8();
LAB_0016fcef:
    pcStack_80 = (code *)0x16fcf4;
    run_test_tcp_alloc_cb_fail_cold_9();
LAB_0016fcf4:
    pcStack_80 = (code *)0x16fcf9;
    run_test_tcp_alloc_cb_fail_cold_10();
LAB_0016fcf9:
    pcStack_80 = (code *)0x16fcfe;
    run_test_tcp_alloc_cb_fail_cold_11();
  }
  pcStack_80 = connect_cb;
  run_test_tcp_alloc_cb_fail_cold_12();
  pcStack_80 = (code *)unaff_RBX;
  if (iVar3 == 0) {
    connect_cb_called = connect_cb_called + 1;
    auStack_90 = uv_buf_init(hello,7);
    uVar5 = *(undefined8 *)((long)&puVar2->u + 0x18);
    puVar7 = &write_req;
    iVar1 = uv_write(&write_req,uVar5,auStack_90,1,write_cb);
    iVar3 = (int)uVar5;
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    connect_cb_cold_1();
    puVar7 = (uv_write_t *)puVar2;
  }
  connect_cb_cold_2();
  if (iVar3 == 0) {
    iVar1 = uv_tcp_init(((uv_tcp_t *)puVar7)->loop,&incoming);
    if (iVar1 != 0) goto LAB_0016fdbd;
    iVar1 = uv_accept(puVar7,&incoming);
    if (iVar1 == 0) {
      iVar1 = uv_read_start(&incoming,conn_alloc_cb,conn_read_cb);
      if (iVar1 == 0) {
        connection_cb_called = connection_cb_called + 1;
        return 0;
      }
      goto LAB_0016fdc7;
    }
  }
  else {
    connection_cb_cold_1();
LAB_0016fdbd:
    connection_cb_cold_2();
  }
  connection_cb_cold_3();
LAB_0016fdc7:
  connection_cb_cold_4();
  return extraout_EAX;
}

Assistant:

static void start_server(void) {
  struct sockaddr_in addr;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  ASSERT(0 == uv_tcp_init(uv_default_loop(), &server));
  ASSERT(0 == uv_tcp_bind(&server, (struct sockaddr*) &addr, 0));
  ASSERT(0 == uv_listen((uv_stream_t*) &server, 128, connection_cb));
}